

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateClear
          (MessageGenerator *this,Printer *printer)

{
  if (this->params_->generate_clear_ == true) {
    io::Printer::Print(printer,"\npublic $classname$ clear() {\n","classname",
                       *(string **)this->descriptor_);
    io::Printer::Indent(printer);
    GenerateFieldInitializers(this,printer);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"  return this;\n}\n");
    return;
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClear(io::Printer* printer) {
  if (!params_.generate_clear()) {
    return;
  }
  printer->Print(
    "\n"
    "public $classname$ clear() {\n",
    "classname", descriptor_->name());
  printer->Indent();

  GenerateFieldInitializers(printer);

  printer->Outdent();
  printer->Print(
    "  return this;\n"
    "}\n");
}